

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::Texture1DArrayView::sampleOffset
          (Texture1DArrayView *this,Sampler *sampler,float s,float t,float lod,deInt32 offset)

{
  WrapMode WVar1;
  undefined4 numLevels;
  undefined4 in_register_00000014;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  selectLayer((Texture1DArrayView *)sampler,t);
  VVar2 = sampleLevelArray1DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,lod,
                     (IVec2 *)CONCAT44(in_register_00000014,offset));
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture1DArrayView::sampleOffset (const Sampler& sampler, float s, float t, float lod, deInt32 offset) const
{
	return sampleLevelArray1DOffset(m_levels, m_numLevels, sampler, s, lod, IVec2(offset, selectLayer(t)));
}